

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void riscv_cpu_set_fflags_riscv32(CPURISCVState_conflict *env,target_ulong_conflict hard)

{
  byte bVar1;
  
  bVar1 = (char)hard * '\x04' & 0x30U | (char)hard << 6;
  (env->fp_status).float_exception_flags =
       (byte)(hard >> 4) & 1 | (byte)(bVar1 >> 1 & 0x50 | (bVar1 & 0x50) * '\x02') >> 2;
  return;
}

Assistant:

void riscv_cpu_set_fflags(CPURISCVState *env, target_ulong hard)
{
    int soft = 0;

    soft |= (hard & FPEXC_NX) ? float_flag_inexact : 0;
    soft |= (hard & FPEXC_UF) ? float_flag_underflow : 0;
    soft |= (hard & FPEXC_OF) ? float_flag_overflow : 0;
    soft |= (hard & FPEXC_DZ) ? float_flag_divbyzero : 0;
    soft |= (hard & FPEXC_NV) ? float_flag_invalid : 0;

    set_float_exception_flags(soft, &env->fp_status);
}